

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O2

int ASN1_STRING_set(ASN1_STRING *str,void *data,int len)

{
  size_t __n;
  uchar *__dest;
  uchar *orig_ptr;
  int in_register_00000014;
  int iVar1;
  
  __n = CONCAT44(in_register_00000014,len);
  if (in_register_00000014 < 0) {
    if (data != (void *)0x0) {
      __n = strlen((char *)data);
      goto LAB_003cb119;
    }
LAB_003cb1b5:
    iVar1 = 0;
  }
  else {
LAB_003cb119:
    if (0x4000000 < __n) {
      ERR_put_error(0xc,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_lib.cc"
                    ,0xf5);
      return 0;
    }
    orig_ptr = str->data;
    if ((int)__n < str->length) {
      __dest = orig_ptr;
      if (orig_ptr == (uchar *)0x0) {
LAB_003cb171:
        __dest = (uchar *)OPENSSL_malloc(__n + 1);
        orig_ptr = (uchar *)0x0;
        goto LAB_003cb17f;
      }
    }
    else {
      if (orig_ptr == (uchar *)0x0) goto LAB_003cb171;
      __dest = (uchar *)OPENSSL_realloc(orig_ptr,__n + 1);
LAB_003cb17f:
      str->data = __dest;
      if (__dest == (uchar *)0x0) {
        str->data = orig_ptr;
        goto LAB_003cb1b5;
      }
    }
    str->length = (int)__n;
    iVar1 = 1;
    if (data != (void *)0x0) {
      if (__n != 0) {
        memcpy(__dest,data,__n);
        __dest = str->data;
      }
      __dest[__n] = '\0';
    }
  }
  return iVar1;
}

Assistant:

int ASN1_STRING_set(ASN1_STRING *str, const void *_data, ossl_ssize_t len_s) {
  const char *data = reinterpret_cast<const char *>(_data);
  size_t len;
  if (len_s < 0) {
    if (data == NULL) {
      return 0;
    }
    len = strlen(data);
  } else {
    len = (size_t)len_s;
  }

  static_assert(ASN1_STRING_MAX < INT_MAX, "len will not overflow int");
  if (len > ASN1_STRING_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }

  if (str->length <= (int)len || str->data == NULL) {
    unsigned char *c = str->data;
    if (c == NULL) {
      str->data = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len + 1));
    } else {
      str->data = reinterpret_cast<uint8_t *>(OPENSSL_realloc(c, len + 1));
    }

    if (str->data == NULL) {
      str->data = c;
      return 0;
    }
  }
  str->length = (int)len;
  if (data != NULL) {
    OPENSSL_memcpy(str->data, data, len);
    // Historically, OpenSSL would NUL-terminate most (but not all)
    // |ASN1_STRING|s, in case anyone accidentally passed |str->data| into a
    // function expecting a C string. We retain this behavior for compatibility,
    // but code must not rely on this. See CVE-2021-3712.
    str->data[len] = '\0';
  }
  return 1;
}